

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistoryTrackerTests.cpp
# Opt level: O2

void __thiscall
solitaire::archivers::HistoryTrackerTests_undoShouldThrowIfHistoryEmpty_Test::TestBody
          (HistoryTrackerTests_undoShouldThrowIfHistoryEmpty_Test *this)

{
  bool bVar1;
  AssertHelper AStack_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  Message local_30 [4];
  
  local_50 = local_40;
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[10] = '\0';
  local_40[0xb] = '\0';
  local_40[0xc] = '\0';
  local_40[0xd] = '\0';
  local_40[0xe] = '\0';
  local_40[0xf] = '\0';
  local_48 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    HistoryTracker::undo(&(this->super_HistoryTrackerTests).historyTracker);
  }
  std::__cxx11::string::assign((char *)&local_50);
  testing::Message::Message(local_30);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/archivers/HistoryTrackerTests.cpp"
             ,0x18,local_50);
  testing::internal::AssertHelper::operator=(&AStack_58,local_30);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if (local_30[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_30[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST_F(HistoryTrackerTests, undoShouldThrowIfHistoryEmpty) {
    EXPECT_THROW(historyTracker.undo(), std::runtime_error);
}